

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int quantize_segment_mix(mixed_segment *segment)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float o_1;
  float s_1;
  uint32_t i_1;
  float o;
  float s;
  uint32_t i;
  float *out;
  float *in;
  mixed_buffer *__out;
  mixed_buffer *__in;
  float local_20;
  uint32_t samples;
  float mix;
  float steps;
  quantize_segment_data *data;
  mixed_segment *segment_local;
  
  _mix = (undefined8 *)segment->data;
  samples = *(uint32_t *)(_mix + 2);
  local_20 = *(float *)((long)_mix + 0x14);
  __in._4_4_ = -NAN;
  __out = (mixed_buffer *)*_mix;
  in = (float *)_mix[1];
  data = (quantize_segment_data *)segment;
  if (__out == (mixed_buffer *)in) {
    mixed_buffer_request_read(&out,(uint32_t *)((long)&__in + 4),__out);
    for (o = 0.0; (uint)o < (uint)__in._4_4_; o = (float)((int)o + 1)) {
      auVar1._0_8_ = (double)(out[(uint)o] * (float)samples);
      auVar1._8_8_ = 0;
      auVar2 = roundsd(auVar1,auVar1,9);
      out[(uint)o] = out[(uint)o] * (1.0 - local_20) +
                     (float)(auVar2._0_8_ / (double)(float)samples) * local_20;
    }
  }
  else {
    mixed_buffer_request_read(&out,(uint32_t *)((long)&__in + 4),__out);
    mixed_buffer_request_write((float **)&s,(uint32_t *)((long)&__in + 4),(mixed_buffer *)in);
    for (o_1 = 0.0; (uint)o_1 < (uint)__in._4_4_; o_1 = (float)((int)o_1 + 1)) {
      auVar2._0_8_ = (double)(out[(uint)o_1] * (float)samples);
      auVar2._8_8_ = 0;
      auVar2 = roundsd(auVar2,auVar2,9);
      _s[(uint)o_1] =
           out[(uint)o_1] * (1.0 - local_20) +
           (float)(auVar2._0_8_ / (double)(float)samples) * local_20;
    }
    mixed_buffer_finish_read((uint32_t)__in._4_4_,__out);
    mixed_buffer_finish_write((uint32_t)__in._4_4_,(mixed_buffer *)in);
  }
  return 1;
}

Assistant:

VECTORIZE int quantize_segment_mix(struct mixed_segment *segment){
  struct quantize_segment_data *data = (struct quantize_segment_data *)segment->data;

  float steps = data->steps;
  float mix = data->mix;
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float s = in[i];
      float o = floor(s * steps) / steps;
      out[i] = LERP(s, o, mix);
    });
  return 1;
}